

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_model_rd_from_var_lapndz(int64_t var,uint n_log2,uint qstep,int *rate,int64_t *dist)

{
  int *in_RCX;
  uint in_EDX;
  byte in_SIL;
  ulong in_RDI;
  long *in_R8;
  int xsq_q10;
  uint64_t xsq_q10_64;
  int r_q10;
  int d_q10;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  if (in_RDI == 0) {
    *in_RCX = 0;
    *in_R8 = 0;
  }
  else {
    model_rd_norm((int)((ulong)in_R8 >> 0x20),
                  (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  (int *)((((ulong)in_EDX * (ulong)in_EDX << (in_SIL + 10 & 0x3f)) +
                          ((long)in_RDI >> 1)) / in_RDI));
    *in_RCX = (in_stack_ffffffffffffffd8 << (in_SIL & 0x1f)) + 1 >> 1;
    *in_R8 = (long)(in_RDI * (long)in_stack_ffffffffffffffdc + 0x200) >> 10;
  }
  return;
}

Assistant:

void av1_model_rd_from_var_lapndz(int64_t var, unsigned int n_log2,
                                  unsigned int qstep, int *rate,
                                  int64_t *dist) {
  // This function models the rate and distortion for a Laplacian
  // source with given variance when quantized with a uniform quantizer
  // with given stepsize. The closed form expressions are in:
  // Hang and Chen, "Source Model for transform video coder and its
  // application - Part I: Fundamental Theory", IEEE Trans. Circ.
  // Sys. for Video Tech., April 1997.
  if (var == 0) {
    *rate = 0;
    *dist = 0;
  } else {
    int d_q10, r_q10;
    static const uint32_t MAX_XSQ_Q10 = 245727;
    const uint64_t xsq_q10_64 =
        (((uint64_t)qstep * qstep << (n_log2 + 10)) + (var >> 1)) / var;
    const int xsq_q10 = (int)AOMMIN(xsq_q10_64, MAX_XSQ_Q10);
    model_rd_norm(xsq_q10, &r_q10, &d_q10);
    *rate = ROUND_POWER_OF_TWO(r_q10 << n_log2, 10 - AV1_PROB_COST_SHIFT);
    *dist = (var * (int64_t)d_q10 + 512) >> 10;
  }
}